

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::uploadImageAspect
          (CopiesAndBlittingTestInstance *this,ConstPixelBufferAccess *imageAccess,VkImage *image,
          ImageParms *parms)

{
  Move<vk::VkCommandBuffer_s_*> *cmdBuffer;
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  ChannelOrder CVar5;
  undefined8 uVar6;
  deUint32 dVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  VkResult VVar13;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *pAVar14;
  TextureFormat TVar15;
  deUint32 dVar16;
  ulong __n;
  VkImageMemoryBarrier *pVVar17;
  deUint32 queueFamilyIndex;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  VkBufferMemoryBarrier preBufferBarrier;
  VkImageMemoryBarrier postImageBarrier;
  undefined8 local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  undefined8 local_c4;
  deUint32 local_bc;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined8 local_ac;
  deUint32 local_a4;
  VkImageMemoryBarrier preImageBarrier;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pAVar14 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  iVar1 = (imageAccess->m_size).m_data[0];
  iVar2 = (imageAccess->m_size).m_data[1];
  iVar3 = (imageAccess->m_size).m_data[2];
  iVar12 = tcu::getPixelSize(imageAccess->m_format);
  __n = (ulong)(uint)(iVar3 * iVar12 * iVar2 * iVar1);
  dVar4 = (parms->extent).depth;
  dVar16 = dVar4;
  dVar7 = 1;
  if (parms->imageType == VK_IMAGE_TYPE_2D) {
    dVar16 = 1;
    dVar7 = dVar4;
  }
  uVar6._0_4_ = (parms->extent).width;
  uVar6._4_4_ = (parms->extent).height;
  preImageBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  preImageBarrier.pNext = (void *)0x0;
  preImageBarrier._16_8_ = (ulong)preImageBarrier.dstAccessMask << 0x20;
  preImageBarrier.srcQueueFamilyIndex = 1;
  preImageBarrier.dstQueueFamilyIndex = 0;
  preImageBarrier.image.m_internal._0_4_ = 1;
  preImageBarrier.subresourceRange._0_8_ = &queueFamilyIndex;
  preImageBarrier._24_8_ = __n;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&preBufferBarrier,vk,device,
                     (VkBufferCreateInfo *)&preImageBarrier,(VkAllocationCallbacks *)0x0);
  postImageBarrier.srcAccessMask = preBufferBarrier.srcAccessMask;
  postImageBarrier.dstAccessMask = preBufferBarrier.dstAccessMask;
  postImageBarrier.oldLayout = preBufferBarrier.srcQueueFamilyIndex;
  postImageBarrier.newLayout = preBufferBarrier.dstQueueFamilyIndex;
  postImageBarrier.sType = preBufferBarrier.sType;
  postImageBarrier._4_4_ = preBufferBarrier._4_4_;
  postImageBarrier.pNext = preBufferBarrier.pNext;
  preBufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  preBufferBarrier._4_4_ = 0;
  preBufferBarrier.pNext = (void *)0x0;
  preBufferBarrier.srcAccessMask = 0;
  preBufferBarrier.dstAccessMask = 0;
  preBufferBarrier.srcQueueFamilyIndex = 0;
  preBufferBarrier.dstQueueFamilyIndex = 0;
  if (buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)postImageBarrier._16_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)postImageBarrier._24_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       postImageBarrier._0_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)postImageBarrier.pNext;
  if (preBufferBarrier._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&preBufferBarrier.pNext,
               (VkBuffer)preBufferBarrier._0_8_);
  }
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&postImageBarrier,vk,device,
             (VkBuffer)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
            );
  (*pAVar14->_vptr_Allocator[3])(&preBufferBarrier,pAVar14,&postImageBarrier,1);
  uVar8 = preBufferBarrier._0_8_;
  VVar13 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,
                      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                      *(undefined8 *)(preBufferBarrier._0_8_ + 8),
                      *(undefined8 *)(preBufferBarrier._0_8_ + 0x10));
  ::vk::checkResult(VVar13,
                    "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x16c);
  preBufferBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  preBufferBarrier.pNext = (void *)0x0;
  preBufferBarrier.srcAccessMask = 0x4000;
  preBufferBarrier.dstAccessMask = 0x800;
  preBufferBarrier.srcQueueFamilyIndex = 0xffffffff;
  preBufferBarrier.dstQueueFamilyIndex = 0xffffffff;
  preBufferBarrier.buffer.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  preBufferBarrier.offset = 0;
  preBufferBarrier.size = __n;
  TVar15 = ::vk::mapVkFormat(parms->format);
  bVar9 = tcu::hasDepthComponent(TVar15.order);
  bVar10 = tcu::hasStencilComponent(TVar15.order);
  iVar1 = (uint)bVar9 * 2 + (uint)bVar10 * 4;
  postImageBarrier.subresourceRange.aspectMask = iVar1 + (uint)(iVar1 == 0);
  bVar9 = false;
  if (iVar1 == 6) {
    CVar5 = (imageAccess->m_format).order;
    bVar9 = tcu::hasDepthComponent(CVar5);
    bVar10 = tcu::hasStencilComponent(CVar5);
    bVar9 = (char)(bVar9 * '\x02' + bVar10 * '\x04') == '\x04';
  }
  preImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  preImageBarrier.pNext = (void *)0x0;
  preImageBarrier.srcAccessMask = 0;
  preImageBarrier.dstAccessMask = 0x1000;
  preImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  preImageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  preImageBarrier.srcQueueFamilyIndex = 0xffffffff;
  preImageBarrier.dstQueueFamilyIndex = 0xffffffff;
  postImageBarrier.image = (VkImage)image->m_internal;
  preImageBarrier.subresourceRange.baseMipLevel = 0;
  preImageBarrier.subresourceRange.levelCount = 1;
  preImageBarrier.subresourceRange.baseArrayLayer = 0;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0x1000;
  postImageBarrier.dstAccessMask = 0x1000;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  postImageBarrier.srcQueueFamilyIndex = 0xffffffff;
  postImageBarrier.dstQueueFamilyIndex = 0xffffffff;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  postImageBarrier.subresourceRange.levelCount = 1;
  postImageBarrier.subresourceRange.baseArrayLayer = 0;
  local_d8 = 0;
  local_d0 = (imageAccess->m_size).m_data[0];
  local_cc = (imageAccess->m_size).m_data[1];
  CVar5 = (imageAccess->m_format).order;
  postImageBarrier.subresourceRange.layerCount = dVar7;
  preImageBarrier.image.m_internal = postImageBarrier.image.m_internal;
  preImageBarrier.subresourceRange.aspectMask = postImageBarrier.subresourceRange.aspectMask;
  preImageBarrier.subresourceRange.layerCount = dVar7;
  bVar10 = tcu::hasDepthComponent(CVar5);
  bVar11 = tcu::hasStencilComponent(CVar5);
  local_c8 = (uint)bVar10 * 2 + (uint)bVar11 * 4;
  local_c8 = local_c8 + (uint)(local_c8 == 0);
  local_c4 = 0;
  local_b8 = 0;
  local_b0 = 0;
  local_bc = dVar7;
  local_ac = uVar6;
  local_a4 = dVar16;
  memcpy(*(void **)(uVar8 + 0x18),imageAccess->m_data,__n);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar8 + 8),*(VkDeviceSize *)(uVar8 + 0x10),__n)
  ;
  VVar13 = (*vk->_vptr_DeviceInterface[0x49])
                     (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar13,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x1c4);
  cmdBuffer = &this->m_cmdBuffer;
  pVVar17 = &preImageBarrier;
  if (bVar9 != false) {
    pVVar17 = (VkImageMemoryBarrier *)0x0;
  }
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x4000,0x1000,0,0,
             0,1,&preBufferBarrier,(ulong)(bVar9 ^ 1),pVVar17);
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,
             buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             image->m_internal,7,1,&local_d8);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,1,0,0,0,0,0
             ,1,&postImageBarrier);
  VVar13 = (*vk->_vptr_DeviceInterface[0x4a])
                     (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(VVar13,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x1c9);
  submitCommandsAndWait(this,vk,device,queue,(VkCommandBuffer *)cmdBuffer);
  if (uVar8 != 0) {
    (**(code **)(*(long *)uVar8 + 8))(uVar8);
  }
  if (buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void CopiesAndBlittingTestInstance::uploadImageAspect (const tcu::ConstPixelBufferAccess& imageAccess, const VkImage& image, const ImageParms& parms)
{
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const VkDevice				vkDevice			= m_context.getDevice();
	const VkQueue				queue				= m_context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&					memAlloc			= m_context.getDefaultAllocator();
	Move<VkBuffer>				buffer;
	const deUint32				bufferSize			= calculateSize(imageAccess);
	de::MovePtr<Allocation>		bufferAlloc;
	const deUint32				arraySize			= getArraySize(parms);
	const VkExtent3D			imageExtent			= getExtent3D(parms);

	// Create source buffer
	{
		const VkBufferCreateInfo			bufferParams			=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			bufferSize,									// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, vkDevice, &bufferParams);
		bufferAlloc = memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));
	}

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier				preBufferBarrier		=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType	sType;
		DE_NULL,										// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,						// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32			dstQueueFamilyIndex;
		*buffer,										// VkBuffer			buffer;
		0u,												// VkDeviceSize		offset;
		bufferSize										// VkDeviceSize		size;
	};

	const VkImageAspectFlags				formatAspect			= getAspectFlags(mapVkFormat(parms.format));
	const bool								skipPreImageBarrier		= formatAspect == (VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT) &&
																	  getAspectFlags(imageAccess.getFormat()) == VK_IMAGE_ASPECT_STENCIL_BIT;
	const VkImageMemoryBarrier				preImageBarrier			=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		image,											// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			formatAspect,	// VkImageAspectFlags	aspect;
			0u,				// deUint32				baseMipLevel;
			1u,				// deUint32				mipLevels;
			0u,				// deUint32				baseArraySlice;
			arraySize,		// deUint32				arraySize;
		}
	};

	const VkImageMemoryBarrier				postImageBarrier		=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		image,											// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			formatAspect,				// VkImageAspectFlags	aspect;
			0u,							// deUint32				baseMipLevel;
			1u,							// deUint32				mipLevels;
			0u,							// deUint32				baseArraySlice;
			arraySize,					// deUint32				arraySize;
		}
	};

	const VkBufferImageCopy		copyRegion		=
	{
		0u,												// VkDeviceSize				bufferOffset;
		(deUint32)imageAccess.getWidth(),				// deUint32					bufferRowLength;
		(deUint32)imageAccess.getHeight(),				// deUint32					bufferImageHeight;
		{
			getAspectFlags(imageAccess.getFormat()),		// VkImageAspectFlags	aspect;
			0u,												// deUint32				mipLevel;
			0u,												// deUint32				baseArrayLayer;
			arraySize,										// deUint32				layerCount;
		},												// VkImageSubresourceLayers	imageSubresource;
		{ 0, 0, 0 },									// VkOffset3D				imageOffset;
		imageExtent										// VkExtent3D				imageExtent;
	};

	// Write buffer data
	deMemcpy(bufferAlloc->getHostPtr(), imageAccess.getDataPtr(), bufferSize);
	flushMappedMemoryRange(vk, vkDevice, bufferAlloc->getMemory(), bufferAlloc->getOffset(), bufferSize);

	// Copy buffer to image
	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL,
						  1, &preBufferBarrier, (skipPreImageBarrier ? 0 : 1), (skipPreImageBarrier ? DE_NULL : &preImageBarrier));
	vk.cmdCopyBufferToImage(*m_cmdBuffer, *buffer, image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &copyRegion);
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	submitCommandsAndWait(vk, vkDevice, queue, *m_cmdBuffer);
}